

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_player_prop_code(parser *p)

{
  char *__s1;
  int iVar1;
  parser_error pVar2;
  char *code;
  void *pvVar3;
  char **code_name;
  
  code = parser_getstr(p,"code");
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s1 = *(char **)((long)pvVar3 + 0x10);
    if (__s1 == (char *)0x0) {
      pVar2 = PARSE_ERROR_MISSING_PLAY_PROP_TYPE;
    }
    else {
      iVar1 = strcmp(__s1,"player");
      if (iVar1 == 0) {
        code_name = player_info_flags;
      }
      else {
        iVar1 = strcmp(__s1,"object");
        if (iVar1 != 0) {
          return PARSE_ERROR_INVALID_PLAY_PROP_CODE;
        }
        code_name = list_obj_flag_names;
      }
      iVar1 = code_index_in_array(code_name,code);
      if (iVar1 < 0) {
        pVar2 = PARSE_ERROR_INVALID_PLAY_PROP_CODE;
      }
      else {
        *(short *)((long)pvVar3 + 8) = (short)iVar1;
        pVar2 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_player_prop_code(struct parser *p) {
	const char *code = parser_getstr(p, "code");
	struct embryo_player_ability *embryo = parser_priv(p);
	int index = -1;

	if (!embryo)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!embryo->ability.type)
		return PARSE_ERROR_MISSING_PLAY_PROP_TYPE;

	if (streq(embryo->ability.type, "player")) {
		index = code_index_in_array(player_info_flags, code);
	} else if (streq(embryo->ability.type, "object")) {
		index = code_index_in_array(list_obj_flag_names, code);
	}
	if (index >= 0) {
		embryo->ability.index = index;
	} else {
		return PARSE_ERROR_INVALID_PLAY_PROP_CODE;
	}
	return PARSE_ERROR_NONE;
}